

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O3

int Ssw_SmlNodeNotEquWeight(Ssw_Sml_t *p,int Left,int Right)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = p->nWordsTotal;
  lVar4 = (long)p->nWordsPref;
  iVar3 = 0;
  if (p->nWordsPref < iVar1) {
    iVar3 = 0;
    do {
      uVar2 = *(uint *)((long)&p[1].pAig + lVar4 * 4 + (long)(Right * iVar1) * 4) ^
              *(uint *)((long)&p[1].pAig + lVar4 * 4 + (long)(Left * iVar1) * 4);
      uVar2 = (uVar2 >> 1 & 0x55555555) + (uVar2 & 0x55555555);
      uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
      uVar2 = (uVar2 >> 4 & 0x7070707) + (uVar2 & 0x7070707);
      uVar2 = (uVar2 >> 8 & 0xf000f) + (uVar2 & 0xf000f);
      iVar3 = (uVar2 >> 0x10) + iVar3 + (uVar2 & 0xffff);
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  return iVar3;
}

Assistant:

int Ssw_SmlNodeNotEquWeight( Ssw_Sml_t * p, int Left, int Right )
{
    unsigned * pSimL, * pSimR;
    int k, Counter = 0;
    pSimL = Ssw_ObjSim( p, Left );
    pSimR = Ssw_ObjSim( p, Right );
    for ( k = p->nWordsPref; k < p->nWordsTotal; k++ )
        Counter += Aig_WordCountOnes( pSimL[k] ^ pSimR[k] );
    return Counter;
}